

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint64_t f;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t u;
  ulong uVar9;
  long lVar10;
  ulong sign;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t q;
  ulong uVar18;
  uint64_t r;
  ulong uVar19;
  uint64_t v;
  ulong uVar20;
  uint64_t c1;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  secp256k1_modinv64_trans2x2 local_a8;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  iVar4 = 0;
  local_88.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[4] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[0] = 1;
  uVar15 = (modinfo->modulus).v[0];
  local_f0 = (modinfo->modulus).v[1];
  local_f8 = (modinfo->modulus).v[2];
  local_100 = (modinfo->modulus).v[3];
  sign = (modinfo->modulus).v[4];
  uVar14 = x->v[0];
  local_108 = x->v[1];
  local_110 = x->v[2];
  uVar3 = x->v[3];
  uVar8 = x->v[4];
  uVar17 = 0xffffffffffffffff;
  do {
    uVar9 = 8;
    iVar2 = 0x3b;
    uVar20 = 0;
    uVar18 = 0;
    uVar19 = 8;
    uVar5 = uVar15;
    uVar7 = uVar14;
    do {
      uVar6 = (long)uVar17 >> 0x3f;
      uVar11 = -(ulong)((uint)uVar7 & 1);
      uVar7 = ((uVar6 ^ uVar5) - uVar6 & uVar11) + uVar7;
      uVar18 = uVar18 + ((uVar6 ^ uVar9) - uVar6 & uVar11);
      uVar19 = uVar19 + ((uVar6 ^ uVar20) - uVar6 & uVar11);
      uVar11 = uVar11 & uVar6;
      uVar17 = (uVar17 ^ uVar11) - 1;
      uVar5 = uVar5 + (uVar7 & uVar11);
      uVar7 = uVar7 >> 1;
      uVar9 = (uVar9 + (uVar18 & uVar11)) * 2;
      uVar20 = (uVar20 + (uVar11 & uVar19)) * 2;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    local_a8.u = uVar9;
    local_a8.v = uVar20;
    local_a8.q = uVar18;
    local_a8.r = uVar19;
    secp256k1_modinv64_update_de_62(&local_88,&local_58,&local_a8,modinfo);
    lVar10 = SUB168(SEXT816((long)uVar20) * SEXT816((long)uVar14),8) +
             SUB168(SEXT816((long)uVar9) * SEXT816((long)uVar15),8) +
             (ulong)CARRY8(uVar20 * uVar14,uVar9 * uVar15);
    lVar12 = SUB168(SEXT816((long)uVar19) * SEXT816((long)uVar14),8) +
             SUB168(SEXT816((long)uVar18) * SEXT816((long)uVar15),8) +
             (ulong)CARRY8(uVar19 * uVar14,uVar18 * uVar15);
    uVar5 = uVar20 * uVar14 + uVar9 * uVar15 >> 0x3e | lVar10 * 4;
    uVar7 = uVar19 * uVar14 + uVar18 * uVar15 >> 0x3e | lVar12 * 4;
    uVar14 = uVar20 * local_108 + uVar9 * local_f0;
    uVar15 = uVar14 + uVar5;
    lVar10 = SUB168(SEXT816((long)uVar20) * SEXT816((long)local_108),8) +
             SUB168(SEXT816((long)uVar9) * SEXT816((long)local_f0),8) +
             (ulong)CARRY8(uVar20 * local_108,uVar9 * local_f0) + (lVar10 >> 0x3e) +
             (ulong)CARRY8(uVar14,uVar5);
    uVar5 = uVar19 * local_108 + uVar18 * local_f0;
    uVar14 = uVar5 + uVar7;
    lVar12 = SUB168(SEXT816((long)uVar19) * SEXT816((long)local_108),8) +
             SUB168(SEXT816((long)uVar18) * SEXT816((long)local_f0),8) +
             (ulong)CARRY8(uVar19 * local_108,uVar18 * local_f0) + (lVar12 >> 0x3e) +
             (ulong)CARRY8(uVar5,uVar7);
    uVar11 = lVar10 * 4 | uVar15 >> 0x3e;
    uVar15 = uVar15 & 0x3fffffffffffffff;
    uVar7 = lVar12 * 4 | uVar14 >> 0x3e;
    uVar14 = uVar14 & 0x3fffffffffffffff;
    uVar5 = uVar20 * local_110 + uVar9 * local_f8;
    local_f0 = uVar5 + uVar11;
    lVar13 = SUB168(SEXT816((long)uVar20) * SEXT816((long)local_110),8) +
             SUB168(SEXT816((long)uVar9) * SEXT816((long)local_f8),8) +
             (ulong)CARRY8(uVar20 * local_110,uVar9 * local_f8) + (lVar10 >> 0x3e) +
             (ulong)CARRY8(uVar5,uVar11);
    uVar5 = uVar19 * local_110 + uVar18 * local_f8;
    local_108 = uVar5 + uVar7;
    lVar10 = SUB168(SEXT816((long)uVar19) * SEXT816((long)local_110),8) +
             SUB168(SEXT816((long)uVar18) * SEXT816((long)local_f8),8) +
             (ulong)CARRY8(uVar19 * local_110,uVar18 * local_f8) + (lVar12 >> 0x3e) +
             (ulong)CARRY8(uVar5,uVar7);
    uVar11 = lVar13 * 4 | local_f0 >> 0x3e;
    local_f0 = local_f0 & 0x3fffffffffffffff;
    uVar7 = lVar10 * 4 | local_108 >> 0x3e;
    local_108 = local_108 & 0x3fffffffffffffff;
    uVar5 = uVar20 * uVar3 + uVar9 * local_100;
    local_f8 = uVar5 + uVar11;
    lVar12 = SUB168(SEXT816((long)uVar20) * SEXT816((long)uVar3),8) +
             SUB168(SEXT816((long)uVar9) * SEXT816((long)local_100),8) +
             (ulong)CARRY8(uVar20 * uVar3,uVar9 * local_100) + (lVar13 >> 0x3e) +
             (ulong)CARRY8(uVar5,uVar11);
    uVar5 = uVar19 * uVar3 + uVar18 * local_100;
    local_110 = uVar5 + uVar7;
    lVar10 = SUB168(SEXT816((long)uVar19) * SEXT816((long)uVar3),8) +
             SUB168(SEXT816((long)uVar18) * SEXT816((long)local_100),8) +
             (ulong)CARRY8(uVar19 * uVar3,uVar18 * local_100) + (lVar10 >> 0x3e) +
             (ulong)CARRY8(uVar5,uVar7);
    uVar16 = lVar12 * 4 | local_f8 >> 0x3e;
    local_f8 = local_f8 & 0x3fffffffffffffff;
    uVar6 = lVar10 * 4 | local_110 >> 0x3e;
    local_110 = local_110 & 0x3fffffffffffffff;
    uVar11 = uVar20 * uVar8 + uVar9 * sign;
    local_100 = uVar11 + uVar16;
    auVar1 = SEXT816((long)sign);
    uVar5 = uVar18 * sign;
    uVar7 = uVar19 * uVar8 + uVar5;
    uVar3 = uVar7 + uVar6;
    sign = (SUB168(SEXT816((long)uVar20) * SEXT816((long)uVar8),8) +
            SUB168(SEXT816((long)uVar9) * SEXT816((long)sign),8) +
            (ulong)CARRY8(uVar20 * uVar8,uVar9 * sign) + (lVar12 >> 0x3e) +
           (ulong)CARRY8(uVar11,uVar16)) * 4 | local_100 >> 0x3e;
    uVar8 = (SUB168(SEXT816((long)uVar19) * SEXT816((long)uVar8),8) +
             SUB168(SEXT816((long)uVar18) * auVar1,8) + (ulong)CARRY8(uVar19 * uVar8,uVar5) +
             (lVar10 >> 0x3e) + (ulong)CARRY8(uVar7,uVar6)) * 4 | uVar3 >> 0x3e;
    local_100 = local_100 & 0x3fffffffffffffff;
    uVar3 = uVar3 & 0x3fffffffffffffff;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 10);
  secp256k1_modinv64_normalize_62(&local_88,sign,modinfo);
  x->v[4] = local_88.v[4];
  x->v[2] = local_88.v[2];
  x->v[3] = local_88.v[3];
  x->v[0] = local_88.v[0];
  x->v[1] = local_88.v[1];
  return;
}

Assistant:

static void secp256k1_modinv64(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int i;
    int64_t zeta = -1; /* zeta = -(delta+1/2); delta starts at 1/2. */

    /* Do 10 iterations of 59 divsteps each = 590 divsteps. This suffices for 256-bit inputs. */
    for (i = 0; i < 10; ++i) {
        /* Compute transition matrix and new zeta after 59 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        zeta = secp256k1_modinv64_divsteps_59(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  (secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) == 0)));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[4], modinfo);
    *x = d;
}